

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::
CodedStreamTest_ReadStringNoReservationSizeIsOverTheClosestLimit_LocalLimitIsCloser_Test::
~CodedStreamTest_ReadStringNoReservationSizeIsOverTheClosestLimit_LocalLimitIsCloser_Test
          (CodedStreamTest_ReadStringNoReservationSizeIsOverTheClosestLimit_LocalLimitIsCloser_Test
           *this)

{
  CodedStreamTest_ReadStringNoReservationSizeIsOverTheClosestLimit_LocalLimitIsCloser_Test
  *this_local;
  
  ~CodedStreamTest_ReadStringNoReservationSizeIsOverTheClosestLimit_LocalLimitIsCloser_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(CodedStreamTest,
       ReadStringNoReservationSizeIsOverTheClosestLimit_LocalLimitIsCloser) {
  memcpy(buffer_, kRawBytes, sizeof(kRawBytes));
  // Buffer size in the input must be smaller than sizeof(kRawBytes),
  // otherwise check against capacity will fail as ReadStringInline()
  // will handle the reading and will reserve the memory as needed.
  ArrayInputStream input(buffer_, sizeof(buffer_), 32);

  {
    CodedInputStream coded_input(&input);
    coded_input.PushLimit(16);
    coded_input.SetTotalBytesLimit(sizeof(buffer_));
    EXPECT_EQ(sizeof(buffer_), coded_input.BytesUntilTotalBytesLimit());

    std::string str;
    EXPECT_FALSE(coded_input.ReadString(&str, strlen(kRawBytes)));
    // Note: this check depends on string class implementation. It
    // expects that string will allocate less than strlen(kRawBytes)
    // for an empty string.
    EXPECT_GT(strlen(kRawBytes), str.capacity());
  }
}